

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O2

TRef lj_opt_fwd_hrefk(jit_State *J)

{
  IRType1 *pIVar1;
  IRIns *pIVar2;
  ushort uVar3;
  ushort uVar4;
  IRIns *pIVar5;
  AliasRet AVar6;
  int iVar7;
  TRef TVar8;
  IRRef1 *pIVar9;
  
  uVar3 = (J->fold).left[0].field_0.op1;
  pIVar9 = J->chain + 0x3b;
  pIVar5 = (J->cur).ir;
  do {
    uVar4 = *pIVar9;
    if (uVar4 <= uVar3) {
      if (*(char *)((long)pIVar5 + (ulong)uVar3 * 8 + 5) == 'R') {
        iVar7 = fwd_aa_tab_clear(J,(uint)uVar3,(uint)uVar3);
        if (iVar7 != 0) {
          pIVar1 = &(J->fold).ins.field_1.t;
          pIVar1->irt = pIVar1->irt & 0x7f;
        }
      }
LAB_0011a632:
      TVar8 = lj_opt_cse(J);
      return TVar8;
    }
    pIVar2 = pIVar5 + uVar4;
    if (uVar3 == (pIVar2->field_0).op1) {
      if ((J->fold).right[0].field_0.op1 == (pIVar2->field_0).op2) {
        iVar7 = fwd_aa_tab_clear(J,(uint)uVar4,(uint)uVar3);
        if (iVar7 != 0) {
          return (uint)uVar4;
        }
      }
      goto LAB_0011a632;
    }
    AVar6 = aa_table(J,(uint)uVar3,(uint)(pIVar2->field_0).op1);
    if (AVar6 != ALIAS_NO) goto LAB_0011a632;
    pIVar9 = &(pIVar2->field_0).prev;
  } while( true );
}

Assistant:

TRef LJ_FASTCALL lj_opt_fwd_hrefk(jit_State *J)
{
  IRRef tab = fleft->op1;
  IRRef ref = J->chain[IR_NEWREF];
  while (ref > tab) {
    IRIns *newref = IR(ref);
    if (tab == newref->op1) {
      if (fright->op1 == newref->op2 && fwd_aa_tab_clear(J, ref, tab))
	return ref;  /* Forward from NEWREF. */
      else
	goto docse;
    } else if (aa_table(J, tab, newref->op1) != ALIAS_NO) {
      goto docse;
    }
    ref = newref->prev;
  }
  /* No conflicting NEWREF: key location unchanged for HREFK of TDUP. */
  if (IR(tab)->o == IR_TDUP && fwd_aa_tab_clear(J, tab, tab))
    fins->t.irt &= ~IRT_GUARD;  /* Drop HREFK guard. */
docse:
  return CSEFOLD;
}